

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O2

void __thiscall TestGCGlobalLimit::TestGCGlobalLimit(TestGCGlobalLimit *this)

{
  TestQueue::TestQueue(&this->super_TestQueue);
  (this->super_TestQueue)._vptr_TestQueue = (_func_int **)&PTR__TestQueue_003e2c60;
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitGCModule();
		nullcSetGlobalMemoryLimit(1024 * 1024);

		const char	*testGCGlobalLimit =
		"import std.gc;\r\n\
		int[] arr1; auto f1(){ arr1 = new int[200000]; } f1();\r\n\
		arr1 = new int[2];\r\n\
		int[] arr2; auto f2(){ arr2 = new int[200000]; } f2();\r\n\
		return arr2.size;";
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;

			testsCount[t]++;
			if(Tests::RunCode(testGCGlobalLimit, testTarget[t], "200000", "GC collection before global limit exceeded error"))
				testsPassed[t]++;
		}
	}